

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdAddVarDef(Dau_Dsd_t *p,char *pStr)

{
  size_t sVar1;
  char (*pacVar2) [32];
  int iVar3;
  long lVar4;
  long lVar5;
  
  sVar1 = strlen(pStr);
  if (7 < sVar1) {
    __assert_fail("strlen(pStr) < 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                  ,0x445,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
  }
  iVar3 = p->nVarsUsed;
  if (iVar3 < 0x20) {
    pacVar2 = p->Cache;
    for (lVar5 = 0; lVar5 < iVar3; lVar5 = lVar5 + 1) {
      pacVar2[iVar3][lVar5] = '\0';
      iVar3 = p->nVarsUsed;
    }
    for (lVar5 = 0; lVar4 = (long)iVar3, lVar5 < lVar4; lVar5 = lVar5 + 1) {
      (*pacVar2)[lVar4] = '\0';
      iVar3 = p->nVarsUsed;
      pacVar2 = pacVar2 + 1;
    }
    p->nVarsUsed = iVar3 + 1;
    strcpy(p->pVarDefs[lVar4],pStr);
    return p->nVarsUsed + -1;
  }
  __assert_fail("p->nVarsUsed < 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                ,0x446,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
}

Assistant:

static inline int Dau_DsdAddVarDef( Dau_Dsd_t * p, char * pStr )
{
    int u;
    assert( strlen(pStr) < 8 );
    assert( p->nVarsUsed < 32 );
    for ( u = 0; u < p->nVarsUsed; u++ )
        p->Cache[p->nVarsUsed][u] = 0;
    for ( u = 0; u < p->nVarsUsed; u++ )
        p->Cache[u][p->nVarsUsed] = 0;
    sprintf( p->pVarDefs[p->nVarsUsed++], "%s", pStr );
    return p->nVarsUsed - 1;
}